

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

size_t mi_bitmap_mask_across
                 (mi_bitmap_index_t bitmap_idx,size_t bitmap_fields,size_t count,size_t *pre_mask,
                 size_t *mid_mask,size_t *post_mask)

{
  long lVar1;
  size_t sVar2;
  sbyte sVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  uVar5 = (uint)bitmap_idx & 0x3f;
  uVar4 = (ulong)uVar5;
  sVar3 = (sbyte)uVar5;
  if (uVar4 + bitmap_fields < 0x41) {
    if (bitmap_fields < 0x40) {
      if (bitmap_fields == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = ~(-1L << ((byte)bitmap_fields & 0x3f)) << sVar3;
      }
    }
    else {
      lVar1 = -1;
    }
    *(long *)count = lVar1;
    *pre_mask = 0;
    sVar6 = 0;
    sVar2 = 0;
  }
  else {
    sVar6 = 0;
    *(ulong *)count = -(ulong)(uVar4 == 0) | ~(-1L << (-sVar3 & 0x3fU)) << sVar3;
    uVar4 = bitmap_fields - (0x40 - uVar4);
    sVar2 = uVar4 >> 6;
    *pre_mask = 0xffffffffffffffff;
    uVar4 = uVar4 & 0x3f;
    if (uVar4 != 0) {
      sVar6 = ~(-1L << (sbyte)uVar4);
    }
  }
  *mid_mask = sVar6;
  return sVar2;
}

Assistant:

static size_t mi_bitmap_mask_across(mi_bitmap_index_t bitmap_idx, size_t bitmap_fields, size_t count, size_t* pre_mask, size_t* mid_mask, size_t* post_mask) {
  MI_UNUSED(bitmap_fields);
  const size_t bitidx = mi_bitmap_index_bit_in_field(bitmap_idx);
  if mi_likely(bitidx + count <= MI_BITMAP_FIELD_BITS) {
    *pre_mask = mi_bitmap_mask_(count, bitidx);
    *mid_mask = 0;
    *post_mask = 0;
    mi_assert_internal(mi_bitmap_index_field(bitmap_idx) < bitmap_fields);
    return 0;
  }